

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::force_tracker_request
          (torrent *this,time_point t,int tracker_idx,reannounce_flags_t flags)

{
  header_holder_type *phVar1;
  byte bVar2;
  bool bVar3;
  time_point32 now;
  announce_entry *paVar4;
  byte bVar5;
  announce_entry e;
  announce_entry local_a0;
  
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) != 0) {
    return;
  }
  if (tracker_idx == -1) {
    phVar1 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
    paVar4 = (announce_entry *)
             (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    if (paVar4 != (announce_entry *)phVar1) {
      bVar2 = 0;
      do {
        bVar5 = bVar2;
        announce_entry::announce_entry(&local_a0,paVar4);
        anon_unknown_135::refresh_endpoint_list
                  ((this->super_torrent_hot_members).m_ses,
                   (bool)((byte)((uint)*(undefined4 *)&this->field_0x5dd >> 0x19) & 1),
                   (bool)((byte)this->field_0x606 >> 6 & 1),&local_a0);
        bVar3 = anon_unknown_135::trigger_announce
                          ((this->super_torrent_hot_members).m_ses,
                           (bool)((byte)((uint)*(undefined4 *)&this->field_0x5dd >> 0x19) & 1),
                           (bool)((byte)this->field_0x606 >> 6 & 1),flags,t,&local_a0);
        announce_entry::~announce_entry(&local_a0);
        paVar4 = (announce_entry *)(paVar4->list_hook).super_type.super_type.next_;
        bVar2 = bVar5 | bVar3;
      } while (paVar4 != (announce_entry *)phVar1);
      if (bVar5 != 0 || bVar3) goto LAB_0031a222;
    }
  }
  else {
    if (tracker_idx < 0) {
      return;
    }
    if ((int)(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.super_size_traits.size_
        <= tracker_idx) {
      return;
    }
    paVar4 = tracker_list::find(&this->m_trackers,tracker_idx);
    if (paVar4 == (announce_entry *)0x0) {
      return;
    }
    bVar3 = anon_unknown_135::trigger_announce
                      ((this->super_torrent_hot_members).m_ses,
                       (bool)((byte)((uint)*(undefined4 *)&this->field_0x5dd >> 0x19) & 1),
                       (bool)((byte)this->field_0x606 >> 6 & 1),flags,t,paVar4);
    if (bVar3) goto LAB_0031a222;
  }
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"*** found no tracker endpoints to announce");
LAB_0031a222:
  now = time_now32();
  update_tracker_timer(this,now);
  return;
}

Assistant:

void torrent::force_tracker_request(time_point const t, int const tracker_idx
		, reannounce_flags_t const flags)
	{
		TORRENT_ASSERT_PRECOND((tracker_idx >= 0
			&& tracker_idx < int(m_trackers.size()))
			|| tracker_idx == -1);

		if (is_paused()) return;
		bool found_one = false;
		if (tracker_idx == -1)
		{
			for (auto e : m_trackers)
			{
				// make sure we check for new endpoints from the listen sockets
				refresh_endpoint_list(m_ses, is_ssl_torrent(), bool(m_complete_sent), e);
				found_one |= trigger_announce(m_ses, is_ssl_torrent(), bool(m_complete_sent), flags, t, e);
			}
		}
		else
		{
			if (tracker_idx < 0 || tracker_idx >= int(m_trackers.size()))
				return;
			auto* e = m_trackers.find(tracker_idx);
			if (e == nullptr) return;
			found_one |= trigger_announce(m_ses, is_ssl_torrent(), bool(m_complete_sent), flags, t, *e);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (!found_one)
		{
			debug_log("*** found no tracker endpoints to announce");
		}
#endif
		update_tracker_timer(aux::time_now32());
	}